

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
LinkedReadsDatastore::get_tag_reads(LinkedReadsDatastore *this,LinkedTag tag)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __lhs;
  const_reference pvVar1;
  value_type in_EDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  difference_type n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *rids;
  pointer *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__val;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  size_type local_30;
  
  __val = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3c2609);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8._M_current);
  this_00 = &in_RSI[0xb].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  __lhs = std::
          lower_bound<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(uint *)__val);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  local_30 = __gnu_cxx::operator-
                       ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         *)__lhs._M_current,
                        (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         *)this_00);
  while (pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &in_RSI[0xb].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish,local_30), *pvVar1 == in_EDX
        ) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
              (in_RSI,(long *)in_RDI);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
              (in_RSI,(long *)in_RDI);
    local_30 = local_30 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<uint64_t> LinkedReadsDatastore::get_tag_reads(LinkedTag tag) const {
    std::vector<uint64_t> rids;
    rids.reserve(10000);
    for (auto n=std::lower_bound(read_tag.begin(),read_tag.end(),tag)-read_tag.begin();read_tag[n]==tag;++n) {
        rids.emplace_back( n * 2 + 1);
        rids.emplace_back( n * 2 + 2);
    }
    return rids;
}